

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

TaskExecutionResult __thiscall
duckdb::PipelineTask::ExecuteTask(PipelineTask *this,TaskExecutionMode mode)

{
  bool bVar1;
  PipelineExecuteResult PVar2;
  string *msg;
  char in_SIL;
  ClientContext *in_RDI;
  PipelineExecuteResult res_1;
  PipelineExecuteResult res;
  pointer in_stack_ffffffffffffff48;
  PipelineExecutor *in_stack_ffffffffffffff50;
  allocator *this_00;
  Event *this_01;
  Pipeline *in_stack_ffffffffffffff70;
  allocator local_79;
  string local_78 [16];
  weak_ptr<duckdb::Task,_true> *in_stack_ffffffffffffff98;
  PipelineExecutor *in_stack_ffffffffffffffa0;
  _func_int **in_stack_ffffffffffffffc0;
  PipelineExecutor *in_stack_ffffffffffffffc8;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>_>
                      *)0x995cbf);
  if (!bVar1) {
    Pipeline::GetClientContext(*(Pipeline **)((long)&(in_RDI->config).home_directory.field_2 + 8));
    make_uniq<duckdb::PipelineExecutor,duckdb::ClientContext&,duckdb::Pipeline&>
              (in_RDI,in_stack_ffffffffffffff70);
    unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>::
    operator=((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
               *)in_stack_ffffffffffffff50,
              (unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
               *)in_stack_ffffffffffffff48);
    unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>::
    ~unique_ptr((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
                 *)0x995d0d);
  }
  unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>::
  operator->((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
              *)in_stack_ffffffffffffff50);
  this_01 = (Event *)&stack0xffffffffffffffc0;
  enable_shared_from_this<duckdb::Task>::shared_from_this
            ((enable_shared_from_this<duckdb::Task> *)in_RDI);
  weak_ptr<duckdb::Task,_true>::weak_ptr<duckdb::Task,_0>
            ((weak_ptr<duckdb::Task,_true> *)in_stack_ffffffffffffff50,
             (shared_ptr<duckdb::Task,_true> *)in_stack_ffffffffffffff48);
  PipelineExecutor::SetTaskForInterrupts(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  weak_ptr<duckdb::Task,_true>::~weak_ptr((weak_ptr<duckdb::Task,_true> *)0x995d6d);
  shared_ptr<duckdb::Task,_true>::~shared_ptr((shared_ptr<duckdb::Task,_true> *)0x995d77);
  if (in_SIL == '\x01') {
    unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>::
    operator->((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
                *)in_stack_ffffffffffffff50);
    PVar2 = PipelineExecutor::Execute(in_stack_ffffffffffffffc8,(idx_t)in_stack_ffffffffffffffc0);
    if (PVar2 != FINISHED) {
      if (PVar2 == NOT_FINISHED) {
        return TASK_NOT_FINISHED;
      }
      if (PVar2 == INTERRUPTED) {
        return TASK_BLOCKED;
      }
    }
  }
  else {
    unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>::
    operator->((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
                *)in_stack_ffffffffffffff50);
    PVar2 = PipelineExecutor::Execute(in_stack_ffffffffffffff50);
    if (PVar2 != FINISHED) {
      if (PVar2 == NOT_FINISHED) {
        msg = (string *)__cxa_allocate_exception(0x10);
        this_00 = &local_79;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_78,"Execute without limit should not return NOT_FINISHED",this_00);
        InternalException::InternalException((InternalException *)this_00,msg);
        __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
      }
      if (PVar2 == INTERRUPTED) {
        return TASK_BLOCKED;
      }
    }
  }
  shared_ptr<duckdb::Event,_true>::operator->
            ((shared_ptr<duckdb::Event,_true> *)in_stack_ffffffffffffff50);
  Event::FinishTask(this_01);
  unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>::reset
            ((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
              *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return TASK_FINISHED;
}

Assistant:

TaskExecutionResult PipelineTask::ExecuteTask(TaskExecutionMode mode) {
	if (!pipeline_executor) {
		pipeline_executor = make_uniq<PipelineExecutor>(pipeline.GetClientContext(), pipeline);
	}

	pipeline_executor->SetTaskForInterrupts(shared_from_this());

	if (mode == TaskExecutionMode::PROCESS_PARTIAL) {
		auto res = pipeline_executor->Execute(PARTIAL_CHUNK_COUNT);

		switch (res) {
		case PipelineExecuteResult::NOT_FINISHED:
			return TaskExecutionResult::TASK_NOT_FINISHED;
		case PipelineExecuteResult::INTERRUPTED:
			return TaskExecutionResult::TASK_BLOCKED;
		case PipelineExecuteResult::FINISHED:
			break;
		}
	} else {
		auto res = pipeline_executor->Execute();
		switch (res) {
		case PipelineExecuteResult::NOT_FINISHED:
			throw InternalException("Execute without limit should not return NOT_FINISHED");
		case PipelineExecuteResult::INTERRUPTED:
			return TaskExecutionResult::TASK_BLOCKED;
		case PipelineExecuteResult::FINISHED:
			break;
		}
	}

	event->FinishTask();
	pipeline_executor.reset();
	return TaskExecutionResult::TASK_FINISHED;
}